

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer.cpp
# Opt level: O0

big_integer * __thiscall big_integer::operator-=(big_integer *this,big_integer *other)

{
  bool bVar1;
  undefined1 local_a8 [8];
  big_integer m_2;
  big_integer m_1;
  big_integer local_58;
  undefined1 local_38 [8];
  big_integer m;
  big_integer *other_local;
  big_integer *this_local;
  
  m._24_8_ = other;
  if (this->sign == other->sign) {
    bVar1 = compare_without_sign_and_equals(this,other);
    if (bVar1) {
      sub(this,(big_integer *)m._24_8_);
    }
    else {
      big_integer(&local_58,(big_integer *)m._24_8_);
      ::operator-((big_integer *)local_38,&local_58,this);
      ~big_integer(&local_58);
      m.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = -this->sign;
      swap(this,(big_integer *)local_38);
      ~big_integer((big_integer *)local_38);
    }
  }
  else if (other->sign == -1) {
    big_integer((big_integer *)&m_2.sign,other);
    operator+=(this,(big_integer *)&m_2.sign);
    ~big_integer((big_integer *)&m_2.sign);
  }
  else {
    big_integer((big_integer *)local_a8,other);
    m_2.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0xff;
    operator+=(this,(big_integer *)local_a8);
    ~big_integer((big_integer *)local_a8);
  }
  cutBadZero(this);
  return this;
}

Assistant:

big_integer &big_integer::operator-=(const big_integer &other) {
    if (sign == other.sign) {
        if (this->compare_without_sign_and_equals(other)) {
            sub(*this, other);
        } else {
            big_integer m = other - (*this);
            m.sign = static_cast<int8_t>(sign * (-1));
            swap(*this, m);
        }
    } else if (other.sign == -1) {
        big_integer m(other);
        m.sign = 1;
        *this += m;
    } else {
        big_integer m(other);
        m.sign = -1;
        *this += m;
    }
    cutBadZero();
    return *this;
}